

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.h
# Opt level: O0

bool __thiscall
soul::UTF8Reader::advanceIfStartsWith<char_const*>(UTF8Reader *this,char *text,char *others)

{
  bool bVar1;
  undefined1 local_21;
  char *others_local;
  char *text_local;
  UTF8Reader *this_local;
  
  bVar1 = advanceIfStartsWith(this,text);
  local_21 = true;
  if (!bVar1) {
    local_21 = advanceIfStartsWith(this,others);
  }
  return local_21;
}

Assistant:

bool advanceIfStartsWith (const char* text, Args... others)      { return advanceIfStartsWith (text) || advanceIfStartsWith (others...); }